

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.cpp
# Opt level: O3

Variable __thiscall
LiteScript::_Type_BOOLEAN::OEqual(_Type_BOOLEAN *this,Variable *obj1,Variable *obj2)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  Object *pOVar4;
  Type *this_00;
  Variable *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar5;
  Variable VVar6;
  
  pOVar4 = Variable::operator->(obj2);
  Memory::Create((Memory *)this,(Type *)pOVar4->memory);
  pOVar4 = Variable::operator->(in_RCX);
  this_00 = Object::GetType(pOVar4);
  bVar3 = Type::operator!=(this_00,(Type *)obj1);
  if (bVar3) {
    pOVar4 = Variable::operator->((Variable *)this);
    *(undefined1 *)pOVar4->data = 0;
    puVar5 = extraout_RDX;
  }
  else {
    pOVar4 = Variable::operator->(obj2);
    cVar1 = *pOVar4->data;
    pOVar4 = Variable::operator->(in_RCX);
    cVar2 = *pOVar4->data;
    pOVar4 = Variable::operator->((Variable *)this);
    *(bool *)pOVar4->data = cVar1 == cVar2;
    puVar5 = extraout_RDX_00;
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_BOOLEAN::OEqual(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    Variable res = obj1->memory.Create(Type::BOOLEAN);
    if (obj2->GetType() != *this)
        res->GetData<bool>() = false;
    else
        res->GetData<bool>() = (obj1->GetData<bool>() == obj2->GetData<bool>());
    return res;
}